

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log.cc
# Opt level: O3

void __thiscall
BuildLog::LogEntry::LogEntry
          (LogEntry *this,string *output,uint64_t command_hash,int start_time,int end_time,
          TimeStamp restat_mtime)

{
  pointer pcVar1;
  
  (this->output)._M_dataplus._M_p = (pointer)&(this->output).field_2;
  pcVar1 = (output->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + output->_M_string_length)
  ;
  this->command_hash = command_hash;
  this->start_time = start_time;
  this->end_time = end_time;
  this->mtime = restat_mtime;
  return;
}

Assistant:

BuildLog::LogEntry::LogEntry(const string& output, uint64_t command_hash,
  int start_time, int end_time, TimeStamp restat_mtime)
  : output(output), command_hash(command_hash),
    start_time(start_time), end_time(end_time), mtime(restat_mtime)
{}